

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_type.cc
# Opt level: O0

void __thiscall Type::GenParseCode2(Type *this,Output *out_cc,Env *env,DataPtr *data,int flags)

{
  bool bVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  undefined8 in_RCX;
  DataPtr *in_RDX;
  Env *in_RSI;
  Type *in_RDI;
  Type *unaff_retaddr;
  string datasize_str;
  ID *in_stack_ffffffffffffff18;
  Env *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff40;
  ID **id;
  Env *in_stack_ffffffffffffff48;
  Env *env_00;
  allocator<char> *in_stack_ffffffffffffff50;
  DataPtr *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  Env *in_stack_ffffffffffffff68;
  FILE *in_stack_ffffffffffffff70;
  string local_80 [7];
  undefined1 in_stack_ffffffffffffff87;
  ID *in_stack_ffffffffffffff88;
  Env *in_stack_ffffffffffffff90;
  int flags_00;
  Type *out_cc_00;
  
  flags_00 = (int)((ulong)in_RCX >> 0x20);
  out_cc_00 = in_RDI;
  if (FLAGS_pac_debug) {
    in_stack_ffffffffffffff70 = _stderr;
    uVar2 = std::__cxx11::string::c_str();
    fprintf(in_stack_ffffffffffffff70,"GenParseCode2 for %s\n",uVar2);
  }
  if ((in_RDI->attr_exportsourcedata_ & 1U) == 0) {
    GenParseCode3(unaff_retaddr,(Output *)out_cc_00,in_RSI,in_RDX,flags_00);
  }
  else {
    bVar1 = incremental_parsing(in_RDI);
    if (bVar1) {
      pcVar3 = (char *)__cxa_allocate_exception(0x20);
      this_00 = &(in_RDI->super_Object).filename;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this_00,pcVar3,in_stack_ffffffffffffff50);
      Exception::Exception
                ((Exception *)in_stack_ffffffffffffff50,(Object *)in_stack_ffffffffffffff48,
                 in_stack_ffffffffffffff40);
      __cxa_throw(pcVar3,&Exception::typeinfo,Exception::~Exception);
    }
    id = &sourcedata_id;
    env_00 = in_RSI;
    pcVar3 = Env::LValue(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    pcVar4 = DataPtr::ptr_expr((DataPtr *)0x14fca0);
    pcVar5 = Env::RValue(in_stack_ffffffffffffff48,(ID *)id);
    Output::println((Output *)in_RSI,"%s = const_bytestring(%s, %s);",pcVar3,pcVar4,pcVar5);
    Env::SetEvaluated(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                      (bool)in_stack_ffffffffffffff87);
    GenParseCode3(unaff_retaddr,(Output *)out_cc_00,env_00,in_RDX,flags_00);
    DataSize_abi_cxx11_(in_RDI,(Output *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                        in_stack_ffffffffffffff60);
    pcVar3 = Env::LValue(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    pcVar4 = DataPtr::ptr_expr((DataPtr *)0x14fd7d);
    uVar2 = std::__cxx11::string::c_str();
    Output::println((Output *)env_00,"%s.set_end(%s + %s);",pcVar3,pcVar4,uVar2);
    std::__cxx11::string::~string(local_80);
  }
  return;
}

Assistant:

void Type::GenParseCode2(Output* out_cc, Env* env, const DataPtr& data, int flags)
	{
	DEBUG_MSG("GenParseCode2 for %s\n", data_id_str_.c_str());

	if ( attr_exportsourcedata_ )
		{
		if ( incremental_parsing() )
			{
			throw Exception(this, "cannot export raw data for incrementally parsed types");
			}

		out_cc->println("%s = const_bytestring(%s, %s);", env->LValue(sourcedata_id),
		                data.ptr_expr(), env->RValue(end_of_data));
		env->SetEvaluated(sourcedata_id);

		GenParseCode3(out_cc, env, data, flags);

		string datasize_str = DataSize(out_cc, env, data);
		out_cc->println("%s.set_end(%s + %s);", env->LValue(sourcedata_id), data.ptr_expr(),
		                datasize_str.c_str());
		}
	else
		{
		GenParseCode3(out_cc, env, data, flags);
		}
	}